

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::QPDFWriter(QPDFWriter *this,QPDF *pdf,char *filename)

{
  Members *this_00;
  char *filename_local;
  QPDF *pdf_local;
  QPDFWriter *this_local;
  
  this_00 = (Members *)operator_new(0x430);
  Members::Members(this_00,pdf);
  std::shared_ptr<QPDFWriter::Members>::shared_ptr<QPDFWriter::Members,void>(&this->m,this_00);
  setOutputFilename(this,filename);
  return;
}

Assistant:

QPDFWriter::QPDFWriter(QPDF& pdf, char const* filename) :
    m(new Members(pdf))
{
    setOutputFilename(filename);
}